

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.cc
# Opt level: O1

void __thiscall PropagationState::step(PropagationState *this)

{
  PcodeOp *pPVar1;
  Varnode *pVVar2;
  _List_node_base *p_Var3;
  pointer ppVVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  _Self __tmp;
  ulong uVar8;
  PcodeOp *pPVar9;
  
  iVar5 = this->slot + 1;
  this->slot = iVar5;
  pPVar1 = this->op;
  if ((int)((ulong)((long)(pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                         _M_impl.super__Vector_impl_data._M_start) >> 3) <= iVar5) {
    pVVar2 = this->vn;
    p_Var3 = (this->iter)._M_node;
    if (p_Var3 != (_List_node_base *)&pVVar2->descend) {
      (this->iter)._M_node = p_Var3->_M_next;
      pPVar1 = (PcodeOp *)p_Var3[1]._M_next;
      this->op = pPVar1;
      uVar6 = 0;
      this->slot = -(uint)(pPVar1->output != (Varnode *)0x0);
      ppVVar4 = (pPVar1->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar8 = (ulong)((long)(pPVar1->inrefs).
                            super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)ppVVar4) >> 3;
      uVar7 = (uint)uVar8;
      if (0 < (int)uVar7) {
        uVar6 = 0;
        do {
          if (ppVVar4[uVar6] == pVVar2) goto LAB_002e9796;
          uVar6 = uVar6 + 1;
        } while ((uVar7 & 0x7fffffff) != uVar6);
        uVar6 = uVar8 & 0xffffffff;
      }
LAB_002e9796:
      this->inslot = (int4)uVar6;
      return;
    }
    pPVar9 = (PcodeOp *)0x0;
    if (pPVar1 != pVVar2->def) {
      pPVar9 = pVVar2->def;
    }
    this->op = pPVar9;
    this->inslot = -1;
    this->slot = 0;
  }
  return;
}

Assistant:

void PropagationState::step(void)

{
  slot += 1;
  if (slot < op->numInput())
    return;
  if (iter != vn->endDescend()) {
    op = *iter++;
    if (op->getOut() != (Varnode *)0)
      slot = -1;
    else
      slot = 0;
    inslot = op->getSlot(vn);
    return;
  }
  if (op == vn->getDef())
    op = (PcodeOp *)0;
  else
    op = vn->getDef();
  inslot = -1;
  slot = 0;
}